

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

BxDFFlags __thiscall
pbrt::LayeredBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF,_true>::Flags
          (LayeredBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF,_true> *this)

{
  bool bVar1;
  BxDFFlags flags;
  BxDFFlags bottomFlags;
  BxDFFlags topFlags;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  LogLevel in_stack_00000044;
  undefined4 in_stack_ffffffffffffffe8;
  BxDFFlags a;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  DielectricBxDF::Flags
            ((DielectricBxDF *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  DiffuseBxDF::Flags((DiffuseBxDF *)0x87e0aa);
  bVar1 = IsTransmissive(Unset);
  if ((!bVar1) && (bVar1 = IsTransmissive(Unset), !bVar1)) {
    LogFatal<char_const(&)[56]>
              (in_stack_00000044,in_stack_00000038,in_stack_00000034,in_stack_00000028,
               (char (*) [56])this);
  }
  a = Reflection;
  bVar1 = IsSpecular(Unset);
  if (bVar1) {
    a = operator|(a,Specular);
  }
  bVar1 = IsDiffuse(Unset);
  if (((bVar1) || (bVar1 = IsDiffuse(Unset), bVar1)) ||
     (bVar1 = SampledSpectrum::operator_cast_to_bool
                        ((SampledSpectrum *)CONCAT44(a,in_stack_ffffffffffffffe8)), bVar1)) {
    a = operator|(a,Diffuse);
  }
  else {
    bVar1 = IsGlossy(Unset);
    if ((bVar1) || (bVar1 = IsGlossy(Unset), bVar1)) {
      a = operator|(a,Glossy);
    }
  }
  bVar1 = IsTransmissive(Unset);
  if ((bVar1) && (bVar1 = IsTransmissive(Unset), bVar1)) {
    a = operator|(a,Transmission);
  }
  return a;
}

Assistant:

PBRT_CPU_GPU
    BxDFFlags Flags() const {
        BxDFFlags topFlags = top.Flags(), bottomFlags = bottom.Flags();
        CHECK(IsTransmissive(topFlags) ||
              IsTransmissive(bottomFlags));  // otherwise, why bother?

        BxDFFlags flags = BxDFFlags::Reflection;
        if (IsSpecular(topFlags))
            flags = flags | BxDFFlags::Specular;

        if (IsDiffuse(topFlags) || IsDiffuse(bottomFlags) || albedo)
            flags = flags | BxDFFlags::Diffuse;
        else if (IsGlossy(topFlags) || IsGlossy(bottomFlags))
            flags = flags | BxDFFlags::Glossy;

        if (IsTransmissive(topFlags) && IsTransmissive(bottomFlags))
            flags = flags | BxDFFlags::Transmission;

        return flags;
    }